

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

void __thiscall cppcms::crypto::hmac::readout(hmac *this,void *ptr)

{
  uint uVar1;
  pointer pmVar2;
  reference pvVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer pmVar4;
  undefined8 in_RSI;
  EVP_PKEY_CTX *ctx;
  hmac *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> digest;
  size_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  allocator_type *in_stack_ffffffffffffff88;
  value_type_conflict3 *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa0;
  
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                         *)0x453e5a);
  (*pmVar2->_vptr_message_digest[2])();
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x453e81);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
             ,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x453ea6);
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                         *)0x453eb4);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  (*pmVar2->_vptr_message_digest[5])(pmVar2,pvVar3);
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                         *)0x453ee4);
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::front
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  pmVar4 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                         *)0x453f06);
  uVar1 = (*pmVar4->_vptr_message_digest[2])();
  (*pmVar2->_vptr_message_digest[4])(pmVar2,this_00,(ulong)uVar1);
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                         *)0x453f43);
  (*pmVar2->_vptr_message_digest[5])(pmVar2,in_RSI);
  pmVar2 = std::
           unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
           ::operator->((unique_ptr<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                         *)0x453f64);
  uVar1 = (*pmVar2->_vptr_message_digest[2])();
  ctx = (EVP_PKEY_CTX *)(ulong)uVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(uVar1,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78,
             (value_type_conflict3 *)0x453f92);
  init(in_RDI,ctx);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  return;
}

Assistant:

void hmac::readout(void *ptr)
	{
		std::vector<unsigned char> digest(md_->digest_size(),0);
		md_->readout(&digest.front()); // md_ is reset
		md_opad_->append(&digest.front(),md_->digest_size());
		md_opad_->readout(ptr); // md_opad_ is reset now
		digest.assign(md_->digest_size(),0);
		init();
	}